

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_mus_opl.cpp
# Opt level: O0

void __thiscall OPLMUSSong::OPLMUSSong(OPLMUSSong *this,FileReader *reader,char *args)

{
  int iVar1;
  OPLmusicFile *this_00;
  undefined4 extraout_var;
  int samples;
  char *args_local;
  FileReader *reader_local;
  OPLMUSSong *this_local;
  
  StreamSong::StreamSong(&this->super_StreamSong);
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__OPLMUSSong_009f0b80;
  OPL_SetCore(args);
  this_00 = (OPLmusicFile *)operator_new(0xca8);
  OPLmusicFile::OPLmusicFile(this_00,reader);
  this->Music = this_00;
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xb])
                    (GSnd,FillStream,0x377c,(ulong)((current_opl_core == 0) + 8),0xc234);
  (this->super_StreamSong).m_Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  if ((this->super_StreamSong).m_Stream == (SoundStream *)0x0) {
    Printf(200,"Could not create music stream.\n");
    if (this->Music != (OPLmusicFile *)0x0) {
      (*(this->Music->super_OPLmusicBlock)._vptr_OPLmusicBlock[1])();
    }
  }
  else {
    OPL_Active = true;
  }
  return;
}

Assistant:

OPLMUSSong::OPLMUSSong (FileReader &reader, const char *args)
{
	int samples = int(OPL_SAMPLE_RATE / 14);

	OPL_SetCore(args);
	Music = new OPLmusicFile (&reader);

	m_Stream = GSnd->CreateStream (FillStream, samples*4,
		(current_opl_core == 0 ? SoundStream::Mono : 0) | SoundStream::Float, int(OPL_SAMPLE_RATE), this);
	if (m_Stream == NULL)
	{
		Printf (PRINT_BOLD, "Could not create music stream.\n");
		delete Music;
		return;
	}
	OPL_Active = true;
}